

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

int __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::copy
          (TypedAttribute<Imath_3_2::Matrix44<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TypedAttribute<Imath_3_2::Matrix44<double>_> *this_00;
  
  this_00 = (TypedAttribute<Imath_3_2::Matrix44<double>_> *)operator_new(0x88);
  memset(this_00,0,0x88);
  Attribute::Attribute((Attribute *)this_00);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e3960;
  (this_00->_value).x[0][0] = 1.0;
  (this_00->_value).x[0][1] = 0.0;
  (this_00->_value).x[0][2] = 0.0;
  (this_00->_value).x[0][3] = 0.0;
  (this_00->_value).x[1][0] = 0.0;
  (this_00->_value).x[1][1] = 1.0;
  (this_00->_value).x[1][2] = 0.0;
  (this_00->_value).x[1][3] = 0.0;
  (this_00->_value).x[2][0] = 0.0;
  (this_00->_value).x[2][1] = 0.0;
  (this_00->_value).x[2][2] = 1.0;
  (this_00->_value).x[2][3] = 0.0;
  (this_00->_value).x[3][0] = 0.0;
  (this_00->_value).x[3][1] = 0.0;
  (this_00->_value).x[3][2] = 0.0;
  (this_00->_value).x[3][3] = 1.0;
  copyValueFrom(this_00,&this->super_Attribute);
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}